

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::initPrograms
          (ComputeBuiltinVarCase *this,SourceCollections *programCollection)

{
  DataType dataType;
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  ostringstream name;
  long *local_3b8;
  long local_3b0;
  long local_3a8 [2];
  uint local_398;
  value_type local_390;
  SourceCollections *local_370;
  ProgramSources *local_368;
  long *local_360;
  long local_350 [2];
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->m_subCases).
      super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_subCases).
      super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    local_370 = programCollection;
    do {
      std::__cxx11::ostringstream::ostringstream(local_320);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,
                          compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_,
                          DAT_00da5f20);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::stringbuf::str();
      local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                            (&local_370->glslSources,&local_340);
      dataType = this->m_varType;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_z = ",0x11);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\n",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"layout(set = 0, binding = 0) uniform Stride\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tuvec2 u_stride;\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}stride;\n",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"layout(set = 0, binding = 1, std430) buffer Output\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      __s = glu::getDataTypeName(dataType);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," result[];\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_out;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\thighp uint offset = stride.u_stride.x*gl_GlobalInvocationID.z + stride.u_stride.y*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                 ,0x86);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tsb_out.result[offset] = ",0x19);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(this->m_varName)._M_dataplus._M_p,
                          (this->m_varName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,(char *)local_360,(allocator<char> *)local_1a8);
      local_398 = 5;
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,local_3b8,local_3b0 + (long)local_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_368->sources + local_398,&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,local_3a8[0] + 1);
      }
      if (local_360 != local_350) {
        operator_delete(local_360,local_350[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(((long)(this->m_subCases).
                                    super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_subCases).
                                    super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void ComputeBuiltinVarCase::initPrograms (SourceCollections& programCollection) const
{
	for (std::size_t i = 0; i < m_subCases.size(); i++)
	{
		const SubCase&	subCase = m_subCases[i];
		std::ostringstream name;
		name << s_prefixProgramName << i;
		programCollection.glslSources.add(name.str()) << glu::ComputeSource(genBuiltinVarSource(m_varName, m_varType, subCase.localSize()).c_str());
	}
}